

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  void *pvVar4;
  ImDrawCmd *__src;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  ImTextureID pvVar10;
  ImDrawChannel *pIVar11;
  long lVar12;
  void *pvVar13;
  ImDrawCmd *pIVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int *local_88;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x5a4,"Split","ImGui ASSERT FAILED: %s",
                "_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
               );
  }
  iVar2 = (this->_Channels).Size;
  iVar16 = iVar2;
  if (iVar2 < channels_count) {
    iVar16 = (this->_Channels).Capacity;
    if (iVar16 < channels_count) {
      if (iVar16 == 0) {
        iVar16 = 8;
      }
      else {
        iVar16 = iVar16 / 2 + iVar16;
      }
      if (iVar16 <= channels_count) {
        iVar16 = channels_count;
      }
      pIVar11 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar16 << 5);
      pIVar3 = (this->_Channels).Data;
      if (pIVar3 != (ImDrawChannel *)0x0) {
        memcpy(pIVar11,pIVar3,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = pIVar11;
      (this->_Channels).Capacity = iVar16;
    }
    (this->_Channels).Size = channels_count;
    iVar16 = channels_count;
  }
  this->_Count = channels_count;
  if (iVar16 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  pIVar3 = (this->_Channels).Data;
  (pIVar3->_IdxBuffer).Size = 0;
  (pIVar3->_IdxBuffer).Capacity = 0;
  (pIVar3->_IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar3->_CmdBuffer).Size = 0;
  (pIVar3->_CmdBuffer).Capacity = 0;
  (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    lVar18 = 1;
    lVar15 = 0x20;
    do {
      lVar12 = (long)(this->_Channels).Size;
      if (lVar18 < iVar2) {
        if (lVar12 <= lVar18) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar3 = (this->_Channels).Data;
        if (*(int *)((long)&(pIVar3->_CmdBuffer).Capacity + lVar15) < 0) {
          pvVar13 = ImGui::MemAlloc(0);
          pvVar4 = *(void **)((long)&(pIVar3->_CmdBuffer).Data + lVar15);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar13,pvVar4,(long)*(int *)((long)&(pIVar3->_CmdBuffer).Size + lVar15) * 0x38);
            ImGui::MemFree(*(void **)((long)&(pIVar3->_CmdBuffer).Data + lVar15));
          }
          *(void **)((long)&(pIVar3->_CmdBuffer).Data + lVar15) = pvVar13;
          *(undefined4 *)((long)&(pIVar3->_CmdBuffer).Capacity + lVar15) = 0;
        }
        *(undefined4 *)((long)&(pIVar3->_CmdBuffer).Size + lVar15) = 0;
        if ((this->_Channels).Size <= lVar18) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar3 = (this->_Channels).Data;
        if (*(int *)((long)&(pIVar3->_IdxBuffer).Capacity + lVar15) < 0) {
          pvVar13 = ImGui::MemAlloc(0);
          pvVar4 = *(void **)((long)&(pIVar3->_IdxBuffer).Data + lVar15);
          if (pvVar4 != (void *)0x0) {
            memcpy(pvVar13,pvVar4,(long)*(int *)((long)&(pIVar3->_IdxBuffer).Size + lVar15) * 2);
            ImGui::MemFree(*(void **)((long)&(pIVar3->_IdxBuffer).Data + lVar15));
          }
          *(void **)((long)&(pIVar3->_IdxBuffer).Data + lVar15) = pvVar13;
          *(undefined4 *)((long)&(pIVar3->_IdxBuffer).Capacity + lVar15) = 0;
        }
        *(undefined4 *)((long)&(pIVar3->_IdxBuffer).Size + lVar15) = 0;
      }
      else {
        if (lVar12 <= lVar18) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        pIVar3 = (this->_Channels).Data;
        puVar1 = (undefined8 *)((long)&(pIVar3->_IdxBuffer).Size + lVar15);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pIVar3->_CmdBuffer).Size + lVar15);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      if ((this->_Channels).Size <= lVar18) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar3 = (this->_Channels).Data;
      if (*(int *)((long)&(pIVar3->_CmdBuffer).Size + lVar15) == 0) {
        fVar5 = (draw_list->_CmdHeader).ClipRect.x;
        fVar6 = (draw_list->_CmdHeader).ClipRect.y;
        fVar7 = (draw_list->_CmdHeader).ClipRect.z;
        fVar8 = (draw_list->_CmdHeader).ClipRect.w;
        pvVar10 = (draw_list->_CmdHeader).TextureId;
        uVar9 = (draw_list->_CmdHeader).VtxOffset;
        if (lVar18 < (this->_Channels).Size) {
          pIVar11 = (ImDrawChannel *)((long)&(pIVar3->_CmdBuffer).Size + lVar15);
          iVar16 = 0;
          if (*(int *)((long)&(pIVar3->_CmdBuffer).Capacity + lVar15) == 0) {
            local_88 = (int *)((long)&(pIVar3->_CmdBuffer).Capacity + lVar15);
LAB_001c7d8d:
            iVar16 = 8;
            iVar17 = 1;
            goto LAB_001c7d98;
          }
LAB_001c7d87:
          pIVar14 = (pIVar11->_CmdBuffer).Data;
        }
        else {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          pIVar3 = (this->_Channels).Data;
          iVar16 = *(int *)((long)&(pIVar3->_CmdBuffer).Size + lVar15);
          pIVar11 = pIVar3 + lVar18;
          if (iVar16 != *(int *)((long)&(pIVar3->_CmdBuffer).Capacity + lVar15)) goto LAB_001c7d87;
          local_88 = &pIVar3[lVar18]._CmdBuffer.Capacity;
          if (iVar16 == 0) goto LAB_001c7d8d;
          iVar17 = iVar16 + 1;
          iVar16 = iVar16 / 2 + iVar16;
LAB_001c7d98:
          if (iVar17 < iVar16) {
            iVar17 = iVar16;
          }
          pIVar14 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar17 * 0x38);
          __src = (pIVar11->_CmdBuffer).Data;
          if (__src != (ImDrawCmd *)0x0) {
            memcpy(pIVar14,__src,(long)(pIVar11->_CmdBuffer).Size * 0x38);
            ImGui::MemFree((pIVar11->_CmdBuffer).Data);
          }
          (pIVar11->_CmdBuffer).Data = pIVar14;
          *local_88 = iVar17;
          iVar16 = (pIVar11->_CmdBuffer).Size;
        }
        pIVar14[iVar16].UserCallbackData = (void *)0x0;
        *(undefined8 *)&pIVar14[iVar16].ElemCount = 0;
        *(ImDrawCallback *)(&pIVar14[iVar16].ElemCount + 2) = (ImDrawCallback)0x0;
        pIVar14[iVar16].TextureId = pvVar10;
        (&pIVar14[iVar16].TextureId)[1] = (ImTextureID)(ulong)uVar9;
        pIVar14 = pIVar14 + iVar16;
        (pIVar14->ClipRect).x = fVar5;
        (pIVar14->ClipRect).y = fVar6;
        (pIVar14->ClipRect).z = fVar7;
        (pIVar14->ClipRect).w = fVar8;
        (pIVar11->_CmdBuffer).Size = (pIVar11->_CmdBuffer).Size + 1;
      }
      lVar18 = lVar18 + 1;
      lVar15 = lVar15 + 0x20;
    } while ((ulong)(uint)channels_count << 5 != lVar15);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            ImDrawCmd_HeaderCopy(&draw_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}